

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kss_Emu.cpp
# Opt level: O2

void __thiscall Kss_Emu::update_gain(Kss_Emu *this)

{
  double dVar1;
  
  if (this->scc_accessed == false) {
    dVar1 = 1.4;
  }
  else {
    dVar1 = 2.0999999999999996;
  }
  dVar1 = dVar1 * (this->super_Classic_Emu).super_Music_Emu.gain_;
  Ay_Apu::volume(&this->ay,dVar1);
  Scc_Apu::volume(&this->scc,dVar1);
  if (this->sn != (Sms_Apu *)0x0) {
    Sms_Apu::volume(this->sn,dVar1);
    return;
  }
  return;
}

Assistant:

void Kss_Emu::update_gain()
{
	double g = gain() * 1.4;
	if ( scc_accessed )
		g *= 1.5;
	ay.volume( g );
	scc.volume( g );
	if ( sn )
		sn->volume( g );
}